

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferVkImpl.cpp
# Opt level: O1

BufferViewWrapper * __thiscall
Diligent::BufferVkImpl::CreateView
          (BufferViewWrapper *__return_storage_ptr__,BufferVkImpl *this,BufferViewDesc *ViewDesc)

{
  VkFormat VVar1;
  RenderDeviceVkImpl *pRVar2;
  string msg;
  VkBufferViewCreateInfo ViewCI;
  string local_78;
  VkBufferViewCreateInfo local_58;
  
  (__return_storage_ptr__->m_pLogicalDevice).
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (__return_storage_ptr__->m_pLogicalDevice).
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __return_storage_ptr__->m_VkObject = (VkBufferView_T *)0x0;
  pRVar2 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
           ::GetDevice((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                        *)this);
  ValidateAndCorrectBufferViewDesc
            (&(this->super_BufferBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
              .m_Desc,ViewDesc,
             (pRVar2->
             super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
             ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.Buffer.
             StructuredBufferOffsetAlignment);
  if ((this->super_BufferBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
      .m_Desc.Mode == BUFFER_MODE_FORMATTED) {
    local_58.format = VK_FORMAT_UNDEFINED;
    local_58._36_4_ = 0;
    local_58.offset = 0;
    local_58.range = 0;
    local_58.sType = VK_STRUCTURE_TYPE_BUFFER_VIEW_CREATE_INFO;
    local_58._4_4_ = 0;
    local_58.pNext = (void *)0x0;
    local_58.flags = 0;
    local_58._20_4_ = 0;
    local_58.buffer = (this->m_VulkanBuffer).m_VkObject;
    if ((ViewDesc->Format).ValueType == VT_UNDEFINED) {
      FormatString<char[17]>(&local_78,(char (*) [17])"Undefined format");
      DebugAssertionFailed
                (local_78._M_dataplus._M_p,"CreateView",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                 ,0x206);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
    }
    VVar1 = TypeToVkFormat((ViewDesc->Format).ValueType,(uint)(ViewDesc->Format).NumComponents,
                           (ViewDesc->Format).IsNormalized);
    local_58.format = VVar1;
    local_58.offset = ViewDesc->ByteOffset;
    local_58.range = ViewDesc->ByteWidth;
    pRVar2 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
             ::GetDevice((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                          *)this);
    VulkanUtilities::VulkanLogicalDevice::CreateBufferView
              ((BufferViewWrapper *)&local_78,
               (pRVar2->m_LogicalVkDevice).
               super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,&local_58,(ViewDesc->super_DeviceObjectAttribs).Name);
    VulkanUtilities::VulkanObjectWrapper<VkBufferView_T_*,_(VulkanUtilities::VulkanHandleTypeId)3>::
    operator=(__return_storage_ptr__,
              (VulkanObjectWrapper<VkBufferView_T_*,_(VulkanUtilities::VulkanHandleTypeId)3> *)
              &local_78);
    VulkanUtilities::VulkanObjectWrapper<VkBufferView_T_*,_(VulkanUtilities::VulkanHandleTypeId)3>::
    ~VulkanObjectWrapper
              ((VulkanObjectWrapper<VkBufferView_T_*,_(VulkanUtilities::VulkanHandleTypeId)3> *)
               &local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

VulkanUtilities::BufferViewWrapper BufferVkImpl::CreateView(struct BufferViewDesc& ViewDesc)
{
    VulkanUtilities::BufferViewWrapper BuffView;
    ValidateAndCorrectBufferViewDesc(m_Desc, ViewDesc, GetDevice()->GetAdapterInfo().Buffer.StructuredBufferOffsetAlignment);
    if (m_Desc.Mode == BUFFER_MODE_FORMATTED)
    {
        VkBufferViewCreateInfo ViewCI{};
        ViewCI.sType  = VK_STRUCTURE_TYPE_BUFFER_VIEW_CREATE_INFO;
        ViewCI.pNext  = nullptr;
        ViewCI.flags  = 0; // reserved for future use
        ViewCI.buffer = m_VulkanBuffer;
        DEV_CHECK_ERR(ViewDesc.Format.ValueType != VT_UNDEFINED, "Undefined format");
        ViewCI.format = TypeToVkFormat(ViewDesc.Format.ValueType, ViewDesc.Format.NumComponents, ViewDesc.Format.IsNormalized);
        ViewCI.offset = ViewDesc.ByteOffset; // offset in bytes from the base address of the buffer
        ViewCI.range  = ViewDesc.ByteWidth;  // size in bytes of the buffer view

        const VulkanUtilities::VulkanLogicalDevice& LogicalDevice{GetDevice()->GetLogicalDevice()};
        BuffView = LogicalDevice.CreateBufferView(ViewCI, ViewDesc.Name);
    }
    else if (m_Desc.Mode == BUFFER_MODE_STRUCTURED ||
             m_Desc.Mode == BUFFER_MODE_RAW)
    {
        // Structured and raw buffers are mapped to storage buffers in GLSL
    }

    return BuffView;
}